

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O3

void v4dwt_interleave_v(v4dwt_t *v,float *a,int x,int nb_elts_read)

{
  int iVar1;
  int iVar2;
  int iVar3;
  v4 *pvVar4;
  float *pfVar5;
  long lVar6;
  
  pvVar4 = v->wavelet;
  iVar1 = v->cas;
  iVar2 = v->sn;
  if (0 < (long)iVar2) {
    lVar6 = 0;
    pfVar5 = a;
    do {
      memcpy((void *)((long)pvVar4 + lVar6 + (long)iVar1 * 0x10),pfVar5,
             (ulong)(uint)nb_elts_read * 4);
      lVar6 = lVar6 + 0x20;
      pfVar5 = pfVar5 + x;
    } while ((long)iVar2 << 5 != lVar6);
  }
  iVar3 = v->dn;
  if (0 < (long)iVar3) {
    pfVar5 = a + x * iVar2;
    lVar6 = 0;
    do {
      memcpy((void *)((long)pvVar4 + lVar6 + (long)iVar1 * -0x10 + 0x10),pfVar5,
             (ulong)(uint)nb_elts_read << 2);
      lVar6 = lVar6 + 0x20;
      pfVar5 = pfVar5 + x;
    } while ((long)iVar3 * 0x20 != lVar6);
  }
  return;
}

Assistant:

static void v4dwt_interleave_v(v4dwt_t* restrict v , float* restrict a , int x, int nb_elts_read){
	v4* restrict bi = v->wavelet + v->cas;
	int i;

	for(i = 0; i < v->sn; ++i){
		memcpy(&bi[i*2], &a[i*x], nb_elts_read * sizeof(float));
	}

	a += v->sn * x;
	bi = v->wavelet + 1 - v->cas;

	for(i = 0; i < v->dn; ++i){
		memcpy(&bi[i*2], &a[i*x], nb_elts_read * sizeof(float));
	}
}